

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg-junk.c
# Opt level: O1

_Bool borg_remove_stuff(void)

{
  borg_item_conflict *item;
  ushort uVar1;
  borg_item_conflict *pbVar2;
  int32_t iVar3;
  _Bool _Var4;
  bool bVar5;
  wchar_t wVar6;
  int32_t iVar7;
  char *what;
  int iVar8;
  long lVar9;
  long lVar10;
  ulong uVar11;
  uint local_54;
  
  wVar6 = borg_first_empty_inventory_slot();
  iVar3 = borg.power;
  if (((wVar6 != L'\xffffffff') && (borg.trait[0x6d] == 0)) && (borg.trait[0x6c] == 0)) {
    if (2000 < borg_t - borg_began) {
      return false;
    }
    if (0x96 < borg.time_this_panel) {
      return false;
    }
    lVar9 = (long)borg.power;
    uVar1 = z_info->pack_size;
    uVar11 = (ulong)uVar1;
    lVar10 = 0;
    if ((uint)uVar1 < uVar1 + 0xc) {
      iVar8 = 0;
      lVar10 = uVar11 * 0x388;
      local_54 = 0xffffffff;
      bVar5 = false;
      do {
        pbVar2 = borg_items;
        if ((borg_items->curses[lVar10 + -0x26] != false) &&
           (borg_items->curses[lVar10 + -0x2c] == true)) {
          item = (borg_item_conflict *)(borg_items->desc + lVar10);
          _Var4 = borg_item_note_needs_id(item);
          if (((!_Var4) || (pbVar2->curses[lVar10 + -2] == true)) &&
             (pbVar2->curses[lVar10 + -0x1a] == false)) {
            memcpy(borg_items + wVar6,item,0x388);
            memcpy(item,safe_items + wVar6,0x388);
            borg_notice(true);
            iVar7 = borg_power();
            memcpy(item,safe_items->desc + lVar10,0x388);
            if (iVar3 <= iVar7) {
              iVar8 = iVar7;
            }
            borg_items[wVar6].iqty = '\0';
            if (iVar3 <= iVar7) {
              local_54 = (uint)uVar11;
            }
            bVar5 = true;
          }
        }
        uVar11 = uVar11 + 1;
        lVar10 = lVar10 + 0x388;
      } while (uVar11 < (ulong)z_info->pack_size + 0xc);
      lVar10 = (long)iVar8;
    }
    else {
      local_54 = 0xffffffff;
      bVar5 = false;
    }
    if (bVar5) {
      borg_notice(true);
    }
    if (-1 < (int)local_54) {
      what = format("# Removing %s.  Power with: (%ld) Power w/o (%ld)",borg_items + local_54,lVar9,
                    lVar10);
      borg_note(what);
      borg_keypress(0x74);
      borg_keypress((int)"abcdefgimnopqrstuvwxyzABCDEFGHIJKLMNOPQRSTUVWXYZ"
                         [(long)(int)local_54 - (ulong)z_info->pack_size]);
      borg.time_this_panel = borg.time_this_panel + 1;
      return true;
    }
  }
  return false;
}

Assistant:

bool borg_remove_stuff(void)
{
    int hole = borg_first_empty_inventory_slot();

    int32_t p, b_p = 0L, w_p = 0L;

    int i, b_i = -1;

    borg_item *item;

    bool fix = false;

    /* if there was no hole, done */
    if (hole == -1)
        return false;

    /*  hack to prevent the swap till you drop loop */
    if (borg.trait[BI_ISHUNGRY] || borg.trait[BI_ISWEAK])
        return false;

    /* Forbid if been sitting on level forever */
    /*    Just come back and work through the loop later */
    if (borg_t - borg_began > 2000)
        return false;
    if (borg.time_this_panel > 150)
        return false;

    /* Start with good power */
    b_p = borg.power;

    /* Scan equip */
    for (i = INVEN_WIELD; i < INVEN_TOTAL; i++) {
        item = &borg_items[i];

        /* Skip empty items */
        if (!item->iqty)
            continue;

        /* Require aware */
        if (!item->aware)
            continue;

        /* Require "known" (or needs id) unless we know it is cursed */
        if (borg_item_note_needs_id(item) && !item->cursed)
            continue;

        /* skip it if it has not been decursed */
        if (item->one_ring)
            continue;

        /* Take off the item */
        memcpy(&borg_items[hole], item, sizeof(borg_item));

        /* Erase the item from equip */
        /* note, copy the "hole" onto the item so it doesn't have attributes */
        memcpy(item, &safe_items[hole], sizeof(borg_item));

        /* Fix later */
        fix = true;

        /* Examine the inventory */
        borg_notice(true);

        /* Evaluate the inventory */
        p = borg_power();

        /* Restore the item */
        memcpy(item, &safe_items[i], sizeof(borg_item));

        /* Restore the hole */
        borg_items[hole].iqty = 0;

        /* Track the crappy items */
        /* crappy includes things that do not add to power */

        if (p >= b_p) {
            b_i = i;
            w_p = p;
        }
    }

    /* Restore bonuses */
    if (fix)
        borg_notice(true);

    /* No item */
    if (b_i >= 0) {
        /* Get the item */
        item = &borg_items[b_i];

        /* Log */
        borg_note(format("# Removing %s.  Power with: (%ld) Power w/o (%ld)",
            item->desc, (long int)b_p, (long int)w_p));

        /* Wear it */
        borg_keypress('t');
        borg_keypress(all_letters_nohjkl[b_i - INVEN_WIELD]);

        /* Did something */
        borg.time_this_panel++;
        return true;
    }

    /* Nope */
    return false;
}